

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O2

Cluster * __thiscall dynet::Cluster::add_child(Cluster *this,uint sym)

{
  iterator iVar1;
  Cluster *this_00;
  ulong uVar2;
  ulong uVar3;
  Cluster *c;
  uint local_3c;
  ulong local_38;
  Cluster *local_30;
  
  local_3c = sym;
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->word2ind)._M_h,&local_3c);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    this_00 = (Cluster *)operator_new(0xc0);
    Cluster(this_00);
    this_00->rep_dim = this->rep_dim;
    local_30 = this_00;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this_00->path,&this->path);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this_00->path,&local_3c);
    uVar2 = (long)(this->children).
                  super__Vector_base<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->children).
                  super__Vector_base<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar3 = uVar2 >> 3;
    local_38 = (uVar2 & 0xfffffffffffffff8) << 0x1d | (ulong)local_3c;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int,unsigned_int>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->word2ind);
    std::vector<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>::push_back
              (&this->children,&local_30);
  }
  else {
    uVar3 = (ulong)*(uint *)((long)iVar1.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ._M_cur + 0xc);
  }
  return (this->children).super__Vector_base<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar3 & 0xffffffff];
}

Assistant:

Cluster* Cluster::add_child(unsigned sym) {
  auto it = word2ind.find(sym);
  unsigned i;
  if (it == word2ind.end()) {
    Cluster* c = new Cluster();
    c->rep_dim = rep_dim;
    c->path = path;
    c->path.push_back(sym);
    i = children.size();
    word2ind.insert(make_pair(sym, i));
    children.push_back(c);
  }
  else {
    i = it->second;
  }
  return children[i];
}